

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

bool __thiscall IR::PropertySymOpnd::ShouldUsePolyEquivTypeGuard(PropertySymOpnd *this,Func *func)

{
  bool bVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  
  if (this->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
    bVar2 = false;
  }
  else {
    bVar1 = ObjTypeSpecFldInfo::IsPoly(this->objTypeSpecFldInfo);
    bVar2 = false;
    if ((bVar1) && (bVar2 = false, (char)this->m_polyCacheUtil < '\0')) {
      this_00 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
      sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
      this_01 = JITTimeWorkItem::GetJITTimeInfo(func->m_workItem);
      functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
      bVar2 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015a4e90,PolyEquivTypeGuardPhase,sourceContextId,functionId)
      ;
      bVar2 = !bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool
PropertySymOpnd::ShouldUsePolyEquivTypeGuard(Func *const func) const
{
    return this->IsPoly() && this->m_polyCacheUtil >= PolymorphicInlineCacheUtilizationThreshold && !PHASE_OFF(Js::PolyEquivTypeGuardPhase, func);
}